

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureValidationError_Test::
TestBody(CommandLineInterfaceTest_FeatureValidationError_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view contents;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str =
       "\n    edition = \"2023\";\n    option features.field_presence = IMPLICIT;\n    message Foo {\n      int32 bar = 1 [default = 5, features.field_presence = FIELD_PRESENCE_UNKNOWN];\n      int32 baz = 2;\n    }"
  ;
  contents._M_len = 199;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str =
       "`field_presence` must resolve to a known value, found FIELD_PRESENCE_UNKNOWN";
  expected_substring._M_len = 0x4c;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureValidationError) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    option features.field_presence = IMPLICIT;
    message Foo {
      int32 bar = 1 [default = 5, features.field_presence = FIELD_PRESENCE_UNKNOWN];
      int32 baz = 2;
    })schema");

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "`field_presence` must resolve to a known value, found "
      "FIELD_PRESENCE_UNKNOWN");
}